

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

enable_if_t<std::is_integral<unsigned_int>::value,_bool>
math::wide_integer::operator==
          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *u,uint *v)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  
  uVar1 = *v;
  puVar3 = (uint *)operator_new(0x800);
  memset(puVar3 + 1,0,0x7fc);
  *puVar3 = uVar1;
  lVar2 = 0x7fc;
  do {
    lVar4 = lVar2;
    if (lVar4 == -4) break;
    lVar2 = lVar4 + -4;
  } while (*(int *)((long)(u->values).
                          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          .elems + lVar4) == *(int *)((long)puVar3 + lVar4));
  operator_delete(puVar3,0x800);
  return lVar4 == -4;
}

Assistant:

constexpr auto operator> (const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const IntegralType& v) -> std::enable_if_t<std::is_integral<IntegralType>::value, bool> { return u.operator> (uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(v)); }